

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

void __thiscall embree::CoronaLoader::loadMapDefinition(CoronaLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  bool bVar1;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *this_01;
  runtime_error *prVar2;
  shared_ptr<embree::Texture> texture;
  string name;
  string local_40;
  
  bVar1 = std::operator!=(&xml->ptr->name,"mapDefinition");
  if (bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_40,&xml->ptr->loc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture,
                   &local_40,": invalid map definition: ");
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &texture,&xml->ptr->name);
    std::runtime_error::runtime_error(prVar2,(string *)&name);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = xml->ptr;
  if ((long)(this_00->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this_00->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    std::__cxx11::string::string((string *)&texture,"name",(allocator *)&local_40);
    XML::parm(&name,this_00,(string *)&texture);
    std::__cxx11::string::~string((string *)&texture);
    loadMap((CoronaLoader *)&texture,(Ref<embree::XML> *)this);
    if (texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_01 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                 ::operator[](&this->textureMap,&name)->
                 super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_01,&texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__cxx11::string::~string((string *)&name);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_((string *)&texture,&xml->ptr->loc);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture
                 ,": invalid map definition");
  std::runtime_error::runtime_error(prVar2,(string *)&name);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoronaLoader::loadMapDefinition(const Ref<XML>& xml) 
  {
    if (xml->name != "mapDefinition") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid map definition: "+xml->name);
    if (xml->children.size() != 1) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid map definition");

    const std::string name = xml->parm("name");
    std::shared_ptr<Texture> texture = loadMap(xml->children[0]);
    if (texture) textureMap[name] = texture;
  }